

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe46At2(uint8_t *buf)

{
  return (ulong)(*buf >> 2) |
         (ulong)((uint)buf[1] << 6 | (uint)buf[2] << 0xe) |
         ((ulong)buf[3] | (ulong)((uint)buf[4] << 8 | (uint)buf[5] << 0x10)) << 0x16;
}

Assistant:

std::uint64_t readFlUIntLe46At2(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 6;
    res |= (buf[0] >> 2);
    res &= UINT64_C(0x3fffffffffff);
    return res;
}